

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.h
# Opt level: O0

jsmntok_t * jsmn_alloc_token(jsmn_parser *parser,jsmntok_t *tokens,size_t num_tokens)

{
  uint uVar1;
  jsmntok_t *tok;
  size_t num_tokens_local;
  jsmntok_t *tokens_local;
  jsmn_parser *parser_local;
  
  if (parser->toknext < num_tokens) {
    uVar1 = parser->toknext;
    parser->toknext = uVar1 + 1;
    parser_local = (jsmn_parser *)(tokens + uVar1);
    ((jsmntok_t *)parser_local)->end = -1;
    ((jsmntok_t *)parser_local)->start = -1;
    ((jsmntok_t *)parser_local)->size = 0;
  }
  else {
    parser_local = (jsmn_parser *)0x0;
  }
  return (jsmntok_t *)parser_local;
}

Assistant:

static jsmntok_t *jsmn_alloc_token(jsmn_parser *parser, jsmntok_t *tokens,
                                   const size_t num_tokens) {
  jsmntok_t *tok;
  if (parser->toknext >= num_tokens) {
    return NULL;
  }
  tok = &tokens[parser->toknext++];
  tok->start = tok->end = -1;
  tok->size = 0;
#ifdef JSMN_PARENT_LINKS
  tok->parent = -1;
#endif
  return tok;
}